

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RunResult __thiscall
wabt::interp::Thread::
DoSimdIsTrue<wabt::interp::Simd<unsigned_int,(unsigned_char)4>,(unsigned_char)4>(Thread *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  Value VVar3;
  
  VVar3 = Pop(this);
  auVar1._0_4_ = -(uint)(VVar3.i32_ == 0);
  auVar1._4_4_ = -(uint)(VVar3._4_4_ == 0);
  auVar1._8_4_ = -(uint)(VVar3._4_4_ == 0);
  auVar1._12_4_ = 0xffffffff;
  auVar2._0_4_ = -(uint)(VVar3._8_4_ == 0);
  auVar2._4_4_ = -(uint)(VVar3._12_4_ == 0);
  auVar2._8_4_ = -(uint)(VVar3._12_4_ == 0);
  auVar2._12_4_ = 0xffffffff;
  VVar3.i64_._1_7_ = 0;
  VVar3.v128_.v[0] =
       3 < (uint)((int)(SUB168(~auVar2 & _DAT_0017d6d0,8) + SUB168(~auVar1 & _DAT_0017d6d0,8)) +
                 SUB164(~auVar2 & _DAT_0017d6d0,0) + SUB164(~auVar1 & _DAT_0017d6d0,0));
  Push(this,VVar3);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdIsTrue() {
  using L = typename S::LaneType;
  auto val = Pop<S>();
  Push(std::count_if(std::begin(val.v), std::end(val.v),
                     [](L x) { return x != 0; }) >= count);
  return RunResult::Ok;
}